

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_resize.cpp
# Opt level: O2

void ncnn::vresize_one(short *rows0p,short *rows1p,int wsize,uchar *Dp,short b0,short b1)

{
  uchar *puVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  long lVar18;
  undefined6 in_register_00000082;
  undefined6 in_register_0000008a;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  auVar19 = ZEXT416((uint)CONCAT62(in_register_00000082,b0));
  auVar19 = pshuflw(auVar19,auVar19,0);
  auVar19._4_4_ = auVar19._0_4_;
  auVar19._8_4_ = auVar19._0_4_;
  auVar19._12_4_ = auVar19._0_4_;
  auVar20 = ZEXT416((uint)CONCAT62(in_register_0000008a,b1));
  auVar20 = pshuflw(auVar20,auVar20,0);
  auVar20._4_4_ = auVar20._0_4_;
  auVar20._8_4_ = auVar20._0_4_;
  auVar20._12_4_ = auVar20._0_4_;
  for (lVar18 = 0; (int)lVar18 + 0xf < wsize; lVar18 = lVar18 + 0x10) {
    auVar21 = pmulhw(*(undefined1 (*) [16])(rows0p + lVar18),auVar19);
    auVar23 = pmulhw(*(undefined1 (*) [16])(rows1p + lVar18),auVar20);
    auVar22 = pmulhw(*(undefined1 (*) [16])(rows0p + lVar18 + 8),auVar19);
    auVar25 = pmulhw(*(undefined1 (*) [16])(rows1p + lVar18 + 8),auVar20);
    auVar24._0_2_ = auVar23._0_2_ + auVar21._0_2_ + 2;
    auVar24._2_2_ = auVar23._2_2_ + auVar21._2_2_ + 2;
    auVar24._4_2_ = auVar23._4_2_ + auVar21._4_2_ + 2;
    auVar24._6_2_ = auVar23._6_2_ + auVar21._6_2_ + 2;
    auVar24._8_2_ = auVar23._8_2_ + auVar21._8_2_ + 2;
    auVar24._10_2_ = auVar23._10_2_ + auVar21._10_2_ + 2;
    auVar24._12_2_ = auVar23._12_2_ + auVar21._12_2_ + 2;
    auVar24._14_2_ = auVar23._14_2_ + auVar21._14_2_ + 2;
    auVar21 = psraw(auVar24,2);
    auVar26._0_2_ = auVar25._0_2_ + auVar22._0_2_ + 2;
    auVar26._2_2_ = auVar25._2_2_ + auVar22._2_2_ + 2;
    auVar26._4_2_ = auVar25._4_2_ + auVar22._4_2_ + 2;
    auVar26._6_2_ = auVar25._6_2_ + auVar22._6_2_ + 2;
    auVar26._8_2_ = auVar25._8_2_ + auVar22._8_2_ + 2;
    auVar26._10_2_ = auVar25._10_2_ + auVar22._10_2_ + 2;
    auVar26._12_2_ = auVar25._12_2_ + auVar22._12_2_ + 2;
    auVar26._14_2_ = auVar25._14_2_ + auVar22._14_2_ + 2;
    auVar22 = psraw(auVar26,2);
    sVar2 = auVar21._0_2_;
    sVar3 = auVar21._2_2_;
    sVar4 = auVar21._4_2_;
    sVar5 = auVar21._6_2_;
    sVar6 = auVar21._8_2_;
    sVar7 = auVar21._10_2_;
    sVar8 = auVar21._12_2_;
    sVar9 = auVar21._14_2_;
    sVar10 = auVar22._0_2_;
    sVar11 = auVar22._2_2_;
    sVar12 = auVar22._4_2_;
    sVar13 = auVar22._6_2_;
    sVar14 = auVar22._8_2_;
    sVar15 = auVar22._10_2_;
    sVar16 = auVar22._12_2_;
    sVar17 = auVar22._14_2_;
    puVar1 = Dp + lVar18;
    *puVar1 = (0 < sVar2) * (sVar2 < 0x100) * auVar21[0] - (0xff < sVar2);
    puVar1[1] = (0 < sVar3) * (sVar3 < 0x100) * auVar21[2] - (0xff < sVar3);
    puVar1[2] = (0 < sVar4) * (sVar4 < 0x100) * auVar21[4] - (0xff < sVar4);
    puVar1[3] = (0 < sVar5) * (sVar5 < 0x100) * auVar21[6] - (0xff < sVar5);
    puVar1[4] = (0 < sVar6) * (sVar6 < 0x100) * auVar21[8] - (0xff < sVar6);
    puVar1[5] = (0 < sVar7) * (sVar7 < 0x100) * auVar21[10] - (0xff < sVar7);
    puVar1[6] = (0 < sVar8) * (sVar8 < 0x100) * auVar21[0xc] - (0xff < sVar8);
    puVar1[7] = (0 < sVar9) * (sVar9 < 0x100) * auVar21[0xe] - (0xff < sVar9);
    puVar1[8] = (0 < sVar10) * (sVar10 < 0x100) * auVar22[0] - (0xff < sVar10);
    puVar1[9] = (0 < sVar11) * (sVar11 < 0x100) * auVar22[2] - (0xff < sVar11);
    puVar1[10] = (0 < sVar12) * (sVar12 < 0x100) * auVar22[4] - (0xff < sVar12);
    puVar1[0xb] = (0 < sVar13) * (sVar13 < 0x100) * auVar22[6] - (0xff < sVar13);
    puVar1[0xc] = (0 < sVar14) * (sVar14 < 0x100) * auVar22[8] - (0xff < sVar14);
    puVar1[0xd] = (0 < sVar15) * (sVar15 < 0x100) * auVar22[10] - (0xff < sVar15);
    puVar1[0xe] = (0 < sVar16) * (sVar16 < 0x100) * auVar22[0xc] - (0xff < sVar16);
    puVar1[0xf] = (0 < sVar17) * (sVar17 < 0x100) * auVar22[0xe] - (0xff < sVar17);
  }
  for (; (int)lVar18 + 7 < wsize; lVar18 = lVar18 + 8) {
    auVar21 = pmulhw(*(undefined1 (*) [16])(rows0p + lVar18),auVar19);
    auVar22 = pmulhw(*(undefined1 (*) [16])(rows1p + lVar18),auVar20);
    auVar23._0_2_ = auVar22._0_2_ + auVar21._0_2_ + 2;
    auVar23._2_2_ = auVar22._2_2_ + auVar21._2_2_ + 2;
    auVar23._4_2_ = auVar22._4_2_ + auVar21._4_2_ + 2;
    auVar23._6_2_ = auVar22._6_2_ + auVar21._6_2_ + 2;
    auVar23._8_2_ = auVar22._8_2_ + auVar21._8_2_ + 2;
    auVar23._10_2_ = auVar22._10_2_ + auVar21._10_2_ + 2;
    auVar23._12_2_ = auVar22._12_2_ + auVar21._12_2_ + 2;
    auVar23._14_2_ = auVar22._14_2_ + auVar21._14_2_ + 2;
    auVar21 = psraw(auVar23,2);
    sVar2 = auVar21._0_2_;
    sVar3 = auVar21._2_2_;
    sVar4 = auVar21._4_2_;
    sVar5 = auVar21._6_2_;
    sVar6 = auVar21._8_2_;
    sVar7 = auVar21._10_2_;
    sVar8 = auVar21._12_2_;
    sVar9 = auVar21._14_2_;
    *(ulong *)(Dp + lVar18) =
         CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar21[0xe] - (0xff < sVar9),
                  CONCAT16((0 < sVar8) * (sVar8 < 0x100) * auVar21[0xc] - (0xff < sVar8),
                           CONCAT15((0 < sVar7) * (sVar7 < 0x100) * auVar21[10] - (0xff < sVar7),
                                    CONCAT14((0 < sVar6) * (sVar6 < 0x100) * auVar21[8] -
                                             (0xff < sVar6),
                                             CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar21[6] -
                                                      (0xff < sVar5),
                                                      CONCAT12((0 < sVar4) * (sVar4 < 0x100) *
                                                               auVar21[4] - (0xff < sVar4),
                                                               CONCAT11((0 < sVar3) *
                                                                        (sVar3 < 0x100) * auVar21[2]
                                                                        - (0xff < sVar3),
                                                                        (0 < sVar2) *
                                                                        (sVar2 < 0x100) * auVar21[0]
                                                                        - (0xff < sVar2))))))));
  }
  for (; (int)lVar18 < wsize; lVar18 = lVar18 + 1) {
    Dp[lVar18] = (uchar)(((uint)((int)rows0p[lVar18] * (int)b0) >> 0x10) +
                         ((uint)((int)rows1p[lVar18] * (int)b1) >> 0x10) + 2 >> 2);
  }
  return;
}

Assistant:

static void vresize_one(const short* rows0p, const short* rows1p, int wsize, unsigned char* Dp, short b0, short b1)
{
    int dx = 0;
#if __ARM_NEON
    int16x8_t _b0 = vdupq_n_s16(b0);
    int16x8_t _b1 = vdupq_n_s16(b1);
    for (; dx + 15 < wsize; dx += 16)
    {
        int16x8_t _r00 = vld1q_s16(rows0p);
        int16x8_t _r01 = vld1q_s16(rows0p + 8);
        int16x8_t _r10 = vld1q_s16(rows1p);
        int16x8_t _r11 = vld1q_s16(rows1p + 8);
        int16x8_t _acc0 = vsraq_n_s16(vshrq_n_s16(vqdmulhq_s16(_r00, _b0), 1), vqdmulhq_s16(_r10, _b1), 1);
        int16x8_t _acc1 = vsraq_n_s16(vshrq_n_s16(vqdmulhq_s16(_r01, _b0), 1), vqdmulhq_s16(_r11, _b1), 1);
        uint8x16_t _Dp = vcombine_u8(vqrshrun_n_s16(_acc0, 2), vqrshrun_n_s16(_acc1, 2));
        vst1q_u8(Dp, _Dp);
        Dp += 16;
        rows0p += 16;
        rows1p += 16;
    }
    for (; dx + 7 < wsize; dx += 8)
    {
        int16x8_t _r0 = vld1q_s16(rows0p);
        int16x8_t _r1 = vld1q_s16(rows1p);
        int16x8_t _acc = vsraq_n_s16(vshrq_n_s16(vqdmulhq_s16(_r0, _b0), 1), vqdmulhq_s16(_r1, _b1), 1);
        uint8x8_t _Dp = vqrshrun_n_s16(_acc, 2);
        vst1_u8(Dp, _Dp);
        Dp += 8;
        rows0p += 8;
        rows1p += 8;
    }
#endif // __ARM_NEON
#if __SSE2__
    __m128i _b0 = _mm_set1_epi16(b0);
    __m128i _b1 = _mm_set1_epi16(b1);
    __m128i _v2 = _mm_set1_epi16(2);
    for (; dx + 15 < wsize; dx += 16)
    {
        __m128i _r00 = _mm_loadu_si128((const __m128i*)rows0p);
        __m128i _r01 = _mm_loadu_si128((const __m128i*)(rows0p + 8));
        __m128i _r10 = _mm_loadu_si128((const __m128i*)rows1p);
        __m128i _r11 = _mm_loadu_si128((const __m128i*)(rows1p + 8));
        __m128i _acc0 = _mm_add_epi16(_mm_mulhi_epi16(_r00, _b0), _mm_mulhi_epi16(_r10, _b1));
        __m128i _acc1 = _mm_add_epi16(_mm_mulhi_epi16(_r01, _b0), _mm_mulhi_epi16(_r11, _b1));
        _acc0 = _mm_srai_epi16(_mm_add_epi16(_acc0, _v2), 2);
        _acc1 = _mm_srai_epi16(_mm_add_epi16(_acc1, _v2), 2);
        __m128i _Dp = _mm_packus_epi16(_acc0, _acc1);
        _mm_storeu_si128((__m128i*)Dp, _Dp);
        Dp += 16;
        rows0p += 16;
        rows1p += 16;
    }
    for (; dx + 7 < wsize; dx += 8)
    {
        __m128i _r0 = _mm_loadu_si128((const __m128i*)rows0p);
        __m128i _r1 = _mm_loadu_si128((const __m128i*)rows1p);
        __m128i _acc = _mm_add_epi16(_mm_mulhi_epi16(_r0, _b0), _mm_mulhi_epi16(_r1, _b1));
        _acc = _mm_srai_epi16(_mm_add_epi16(_acc, _v2), 2);
        __m128i _Dp = _mm_packus_epi16(_acc, _acc);
        _mm_storel_epi64((__m128i*)Dp, _Dp);
        Dp += 8;
        rows0p += 8;
        rows1p += 8;
    }
#endif // __SSE2__
    for (; dx < wsize; dx++)
    {
        short s0 = *rows0p++;
        short s1 = *rows1p++;

        *Dp++ = (unsigned char)(((short)((b0 * s0) >> 16) + (short)((b1 * s1) >> 16) + 2) >> 2);
    }
}